

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O2

void libtorrent::aux::initialize_storage
               (file_storage *fs,string *save_path,stat_cache *sc,
               vector<download_priority_t,_file_index_t> *file_priority,
               function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
               *create_file,
               function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
               *create_link,
               function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
               oversized_file,storage_error *ec)

{
  pointer psVar1;
  _Alloc_hider _Var2;
  size_type this;
  bool bVar3;
  file_flags_t fVar4;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar5;
  int64_t __args_1;
  int64_t iVar6;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
  *pfVar7;
  undefined1 uVar8;
  file_index_t index;
  ulong uVar9;
  string_view base;
  string_view target_00;
  allocator<char> local_131;
  error_code err;
  string path;
  size_t local_d0;
  char *local_c8;
  string local_b0;
  string target;
  string local_70;
  string local_50;
  
  pfVar7 = create_link;
  iVar5 = file_storage::file_range(fs);
  uVar9 = (ulong)iVar5._begin.m_val.m_val;
  do {
    if ((long)iVar5 >> 0x20 == uVar9) {
      return;
    }
    psVar1 = (file_priority->
             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ).
             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(*(int *)&(file_priority->
                         super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                         ).
                         super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1) <= (long)uVar9)
       || (psVar1[uVar9].m_val != '\0')) {
      index.m_val = (int)uVar9;
      bVar3 = file_storage::pad_file_at(fs,index);
      if (!bVar3) {
        err.val_ = 0;
        err._4_4_ = err._4_4_ & 0xffffff00;
        err.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                    super_error_category;
        __args_1 = stat_cache::get_filesize(sc,index,fs,save_path,&err);
        uVar8 = (undefined1)(uVar9 >> 0x10);
        if (err.failed_ == true) {
          path._0_16_ = boost::system::errc::make_error_condition(no_such_file_or_directory);
          bVar3 = boost::system::operator!=(&err,(error_condition *)&path);
          if (bVar3) {
            *(short *)(oversized_file.super__Function_base._M_functor._8_8_ + 0x10) = (short)uVar9;
            *(undefined1 *)(oversized_file.super__Function_base._M_functor._8_8_ + 0x12) = uVar8;
            *(undefined1 *)(oversized_file.super__Function_base._M_functor._8_8_ + 0x13) = 0x18;
            *(ulong *)oversized_file.super__Function_base._M_functor._8_8_ =
                 CONCAT44(err._4_4_,err.val_);
            *(error_category **)(oversized_file.super__Function_base._M_functor._8_8_ + 8) =
                 err.cat_;
            return;
          }
        }
        iVar6 = file_storage::file_size(fs,index);
        if ((iVar6 < __args_1) && (err.failed_ == false)) {
          ::std::
          function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
          ::operator()((function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
                        *)oversized_file.super__Function_base._M_functor._M_unused._0_8_,
                       (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)index.m_val,
                       __args_1);
        }
        if (iVar6 == 0) {
          fVar4 = file_storage::file_flags(fs,index);
          if ((fVar4.m_val & 8) == 0) {
            path._0_16_ = boost::system::errc::make_error_condition(no_such_file_or_directory);
            bVar3 = boost::system::operator==(&err,(error_condition *)&path);
            if (bVar3) {
              *(undefined4 *)oversized_file.super__Function_base._M_functor._8_8_ = 0;
              *(undefined1 *)(oversized_file.super__Function_base._M_functor._8_8_ + 4) = 0;
              *(system_error_category **)(oversized_file.super__Function_base._M_functor._8_8_ + 8)
                   = &boost::system::detail::cat_holder<void>::system_category_instance;
              ::std::
              function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
              ::operator()(create_file,
                           (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)index.m_val,
                           (storage_error *)oversized_file.super__Function_base._M_functor._8_8_);
              if (*(int *)oversized_file.super__Function_base._M_functor._8_8_ != 0) {
                return;
              }
            }
          }
          else {
            file_storage::file_path(&path,fs,index,save_path);
            ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_131);
            file_storage::file_path(&local_50,fs,index,&local_70);
            parent_path(&local_b0,&local_50);
            this = local_b0._M_string_length;
            _Var2._M_p = local_b0._M_dataplus._M_p;
            file_storage::symlink_abi_cxx11_
                      ((file_storage *)&local_d0,(char *)fs,(char *)(uVar9 & 0xffffffff));
            base._M_str = local_c8;
            base._M_len = (size_t)_Var2._M_p;
            target_00._M_str = (char *)pfVar7;
            target_00._M_len = local_d0;
            lexically_relative_abi_cxx11_(&target,(libtorrent *)this,base,target_00);
            ::std::__cxx11::string::~string((string *)&local_d0);
            ::std::__cxx11::string::~string((string *)&local_b0);
            ::std::__cxx11::string::~string((string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_70);
            ::std::
            function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
            ::operator()(create_link,&target,&path,
                         (storage_error *)oversized_file.super__Function_base._M_functor._8_8_);
            if (*(char *)(oversized_file.super__Function_base._M_functor._8_8_ + 4) != '\0') {
              *(short *)(oversized_file.super__Function_base._M_functor._8_8_ + 0x10) = (short)uVar9
              ;
              *(undefined1 *)(oversized_file.super__Function_base._M_functor._8_8_ + 0x12) = uVar8;
              ::std::__cxx11::string::~string((string *)&target);
              ::std::__cxx11::string::~string((string *)&path);
              return;
            }
            ::std::__cxx11::string::~string((string *)&target);
            ::std::__cxx11::string::~string((string *)&path);
          }
        }
        *(undefined4 *)oversized_file.super__Function_base._M_functor._8_8_ = 0;
        *(undefined1 *)(oversized_file.super__Function_base._M_functor._8_8_ + 4) = 0;
        *(system_error_category **)(oversized_file.super__Function_base._M_functor._8_8_ + 8) =
             &boost::system::detail::cat_holder<void>::system_category_instance;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void initialize_storage(file_storage const& fs
		, std::string const& save_path
		, stat_cache& sc
		, aux::vector<download_priority_t, file_index_t> const& file_priority
		, std::function<void(file_index_t, storage_error&)> create_file
		, std::function<void(std::string const&, std::string const&, storage_error&)> create_link
		, std::function<void(file_index_t, std::int64_t)> oversized_file
		, storage_error& ec)
	{
		// create zero-sized files
		for (auto const file_index : fs.file_range())
		{
			// ignore files that have priority 0
			if (file_priority.end_index() > file_index
				&& file_priority[file_index] == dont_download)
			{
				continue;
			}

			// ignore pad files
			if (fs.pad_file_at(file_index)) continue;

			// this is just to see if the file exists
			error_code err;
			auto const sz = sc.get_filesize(file_index, fs, save_path, err);

			if (err && err != boost::system::errc::no_such_file_or_directory)
			{
				ec.file(file_index);
				ec.operation = operation_t::file_stat;
				ec.ec = err;
				break;
			}

			auto const fs_file_size = fs.file_size(file_index);
			if (!err && sz > fs_file_size)
			{
				// this file is oversized, alert the client
				oversized_file(file_index, sz);
			}

			// if the file is empty and doesn't already exist, create it
			// deliberately don't truncate files that already exist
			// if a file is supposed to have size 0, but already exists, we will
			// never truncate it to 0.
			if (fs_file_size == 0)
			{
				// create symlinks
				if (fs.file_flags(file_index) & file_storage::flag_symlink)
				{
#if TORRENT_HAS_SYMLINK
					std::string const path = fs.file_path(file_index, save_path);
					// we make the symlink target relative to the link itself
					std::string const target = lexically_relative(
						parent_path(fs.file_path(file_index)), fs.symlink(file_index));
					create_link(target, path, ec);
					if (ec.ec)
					{
						ec.file(file_index);
						return;
					}
#else
					TORRENT_UNUSED(create_link);
#endif
				}
				else if (err == boost::system::errc::no_such_file_or_directory)
				{
					// just creating the file is enough to make it zero-sized. If
					// there's a race here and some other process truncates the file,
					// it's not a problem, we won't access empty files ever again
					ec.ec.clear();
					create_file(file_index, ec);
					if (ec) return;
				}
			}
			ec.ec.clear();
		}
	}